

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurl.cpp
# Opt level: O2

void TPZShapeHCurl<pzshape::TPZShapeLinear>::CalcH1ShapeOrders
               (TPZVec<int> *ordHCurl,TPZVec<int> *ordH1)

{
  bool bVar1;
  int iVar2;
  MElementType MVar3;
  int iVar4;
  int **ppiVar5;
  int *piVar6;
  uint uVar7;
  int *ihSide;
  int *piVar8;
  int iVar9;
  long lStack_90;
  TPZStack<int,_10> highDimSides;
  
  if (ordH1->fNElements != 1) {
    highDimSides.super_TPZManVector<int,_10>.super_TPZVec<int>._vptr_TPZVec._0_4_ = 0xffffffff;
    (*ordH1->_vptr_TPZVec[2])(ordH1,1);
  }
  bVar1 = true;
  lStack_90 = 0;
  do {
    if (!bVar1) {
      return;
    }
    iVar2 = pztopology::TPZLine::SideDimension(2);
    MVar3 = pztopology::TPZLine::Type(2);
    uVar7 = 1;
    if (MVar3 != EQuadrilateral) {
      MVar3 = pztopology::TPZLine::Type(2);
      uVar7 = 1;
      if (MVar3 != ECube) {
        MVar3 = pztopology::TPZLine::Type(2);
        uVar7 = (uint)(MVar3 == EPrisma);
      }
    }
    TPZStack<int,_10>::TPZStack(&highDimSides);
    pztopology::TPZLine::HigherDimensionSides(2,&highDimSides);
    iVar9 = ordHCurl->fStore[lStack_90];
    ppiVar5 = TPZVec<int>::begin((TPZVec<int> *)&highDimSides);
    piVar8 = *ppiVar5;
    piVar6 = TPZVec<int>::end((TPZVec<int> *)&highDimSides);
    iVar9 = iVar9 + uVar7;
    for (; piVar8 != piVar6; piVar8 = piVar8 + 1) {
      iVar4 = pztopology::TPZLine::SideDimension(*piVar8);
      if (iVar4 != iVar2 + 1) break;
      iVar4 = ordHCurl->fStore[(long)*piVar8 + -2];
      MVar3 = pztopology::TPZLine::Type(*piVar8);
      uVar7 = 1;
      if (MVar3 != EQuadrilateral) {
        MVar3 = pztopology::TPZLine::Type(*piVar8);
        uVar7 = 1;
        if (MVar3 != ECube) {
          MVar3 = pztopology::TPZLine::Type(*piVar8);
          uVar7 = (uint)(MVar3 == EPrisma);
        }
      }
      iVar4 = uVar7 + iVar4;
      if (iVar9 <= iVar4) {
        iVar9 = iVar4;
      }
    }
    ordH1->fStore[lStack_90] = iVar9;
    TPZManVector<int,_10>::~TPZManVector(&highDimSides.super_TPZManVector<int,_10>);
    bVar1 = false;
    lStack_90 = 1;
  } while( true );
}

Assistant:

void TPZShapeHCurl<TSHAPE>::CalcH1ShapeOrders(
    const TPZVec<int> &ordHCurl,
    TPZVec<int> &ordH1)
{
    constexpr auto nConnects = TSHAPE::NSides-TSHAPE::NCornerNodes;
    if(ordH1.size() != nConnects)  ordH1.Resize(nConnects,-1);
    for(auto iCon = 0; iCon < nConnects; iCon++){
        const auto iSide = iCon + TSHAPE::NCornerNodes;
        const auto sideDim = TSHAPE::SideDimension(iSide);
        const bool quadSide =
            TSHAPE::Type(iSide) == EQuadrilateral ||
            TSHAPE::Type(iSide) == ECube ||
            TSHAPE::Type(iSide) == EPrisma;
        /*some H1 functions associated with the side iSide of dimension dim
          might be needed for computing the shape functions of a side with
          dimension dim+1 that contains the side iSide.
          It is also worth noting that quadrilateral sides require functions
          of ordH1er k+1*/
        TPZStack<int> highDimSides;
        TSHAPE::HigherDimensionSides(iSide, highDimSides);
        const auto sideOrder = ordHCurl[iCon];
        auto maxOrder = quadSide ? sideOrder + 1: sideOrder;
        for(auto &ihSide : highDimSides){
            if(TSHAPE::SideDimension(ihSide) != sideDim+1) break;
            else {
                const auto hSideOrder = ordHCurl[ihSide-TSHAPE::NCornerNodes];
                const auto hQuadSide =
                    TSHAPE::Type(ihSide) == EQuadrilateral ||
                    TSHAPE::Type(ihSide) == ECube ||
                    TSHAPE::Type(ihSide) == EPrisma;
                const auto hMaxOrder = hQuadSide ? hSideOrder + 1 : hSideOrder;
                maxOrder = std::max(maxOrder, hMaxOrder);
            }
        }
        ordH1[iCon] = maxOrder;
    }
}